

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O3

void __thiscall amrex::MLNodeLinOp::buildMasks(MLNodeLinOp *this)

{
  MultiFab *this_00;
  pointer paVar1;
  pointer paVar2;
  __uniq_ptr_data<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>,_true,_true> cmf;
  __uniq_ptr_data<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>,_true,_true> this_01;
  __uniq_ptr_data<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>,_true,_true>
  _Var3;
  __uniq_ptr_data<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>,_true,_true> fmf;
  iMultiFab *piVar4;
  Geometry *geom;
  GpuArray<amrex::LinOpBCType,_3U> bchi;
  __uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_> domain;
  LinOpBCType LVar5;
  MLNodeLinOp *pMVar6;
  ulong uVar7;
  ulong uVar8;
  int i;
  int iVar9;
  int iVar10;
  pointer paVar11;
  pointer paVar12;
  long lVar13;
  pointer pVVar14;
  long lVar15;
  pointer piVar16;
  pointer puVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  byte bVar22;
  uint uVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  bool bVar30;
  Periodicity PVar31;
  GpuArray<amrex::LinOpBCType,_3U> bclo;
  Box bx;
  MFIter mfi;
  iMultiFab ccm;
  Array4<int> local_3c0;
  __uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_> local_380;
  long local_378;
  LinOpBCType local_36c;
  long local_368;
  FabArrayBase *local_360;
  long local_358;
  MLNodeLinOp *local_350;
  FabArray<amrex::IArrayBox> *local_348;
  ulong local_340;
  GpuArray<amrex::LinOpBCType,_3U> local_338;
  LinOpBCType local_32c;
  undefined8 local_328;
  int local_320;
  int local_31c [2];
  undefined8 uStack_314;
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  GpuArray<amrex::LinOpBCType,_3U> local_2d8;
  undefined1 local_2c8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_2b8;
  int local_2a0;
  Vector<int,_std::allocator<int>_> *local_290;
  MFItInfo local_264;
  Array4<const_int> local_250;
  ulong local_210;
  long local_208;
  long local_200;
  ulong local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  Periodicity local_1d8;
  Box local_1cc;
  undefined1 local_1b0 [8];
  FabArrayBase *local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  avStack_1a0 [15];
  
  if (this->m_masks_built != false) {
    return;
  }
  this->m_is_bottom_singular = false;
  this->m_masks_built = true;
  paVar1 = (this->super_MLLinOp).m_lobc.
           super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           .
           super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1b0._0_4_ = 0x65;
  paVar11 = (pointer)std::
                     __find_if<amrex::LinOpBCType*,__gnu_cxx::__ops::_Iter_equals_val<amrex::LinOpBCType_const>>
                               (paVar1,paVar1 + 1,local_1b0);
  paVar1 = (this->super_MLLinOp).m_hibc.
           super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           .
           super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1b0._0_4_ = 0x65;
  paVar12 = (pointer)std::
                     __find_if<amrex::LinOpBCType*,__gnu_cxx::__ops::_Iter_equals_val<amrex::LinOpBCType_const>>
                               (paVar1,paVar1 + 1,local_1b0);
  paVar1 = (this->super_MLLinOp).m_lobc.
           super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           .
           super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar2 = (this->super_MLLinOp).m_hibc.
           super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           .
           super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((paVar11 == paVar1 + 1) && (paVar12 == paVar2 + 1)) {
    bVar22 = this->m_overset_dirichlet_mask ^ 1;
    if (*(this->super_MLLinOp).m_domain_covered.super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start == 0
       ) {
      bVar22 = false;
    }
    this->m_is_bottom_singular = (bool)bVar22;
  }
  local_2d8.arr._0_8_ = *(undefined8 *)paVar1->_M_elems;
  local_36c = paVar1->_M_elems[2];
  local_338.arr._0_8_ = *(undefined8 *)paVar2->_M_elems;
  local_338.arr[2] = paVar2->_M_elems[2];
  iVar10 = (this->super_MLLinOp).m_num_amr_levels;
  local_350 = this;
  local_32c = local_338.arr[2];
  local_2d8.arr[2] = local_36c;
  if (0 < iVar10) {
    local_1e8 = local_2d8.arr._0_8_ & 0xffffffff;
    local_1f0 = local_338.arr._0_8_ & 0xffffffff;
    local_1f8 = local_2d8.arr._0_8_ & 0xffffffff00000000;
    local_1e0 = local_338.arr._0_8_ & 0xffffffff00000000;
    piVar16 = (this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
    lVar24 = 0;
    local_210 = local_2d8.arr._0_8_;
    do {
      if (0 < piVar16[lVar24]) {
        local_308 = lVar24 * 3;
        local_200 = lVar24 * 0x18;
        lVar13 = 0;
        local_208 = lVar24;
        do {
          lVar24 = *(long *)((long)&(((this->super_MLLinOp).m_geom.
                                      super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                      .
                                      super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>)
                                    .
                                    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                            + local_308 * 8);
          local_358 = lVar13;
          local_1d8 = Geometry::periodicity((Geometry *)(lVar24 + lVar13 * 200));
          lVar24 = lVar24 + lVar13 * 200;
          local_328 = *(undefined8 *)(((Box *)(lVar24 + 0xac))->smallend).vect;
          local_31c[1] = (int)((ulong)*(undefined8 *)(lVar24 + 0xb8) >> 0x20);
          uStack_314 = *(undefined8 *)(lVar24 + 0xc0);
          local_320 = (int)*(undefined8 *)(lVar24 + 0xb4);
          local_31c[0] = (int)((ulong)*(undefined8 *)(lVar24 + 0xb4) >> 0x20);
          lVar13 = 0;
          do {
            if ((uStack_314._4_4_ >> ((uint)lVar13 & 0x1f) & 1) == 0) {
              local_31c[lVar13] = local_31c[lVar13] + 1;
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          uStack_314 = CONCAT44(7,(int)uStack_314);
          local_348 = *(FabArray<amrex::IArrayBox> **)
                       (*(long *)((long)&(((this->m_dirichlet_mask).
                                           super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                           .
                                           super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                                         ).
                                         super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                                 + local_200) + local_358 * 8);
          local_2c8._0_8_ =
               (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
          vStack_2b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_2b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_2c8._8_8_ = (FabArrayBase *)0x0;
          vStack_2b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_3c0.p = (int *)&PTR__FabFactory_00713508;
          iMultiFab::iMultiFab
                    ((iMultiFab *)local_1b0,
                     (BoxArray *)
                     (local_358 * 0x68 +
                     *(long *)((long)&(((this->super_MLLinOp).m_grids.
                                        super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                        .
                                        super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                      ).
                                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                              + local_200)),
                     (DistributionMapping *)
                     (local_358 * 0x10 +
                     *(long *)((long)&(((this->super_MLLinOp).m_dmap.
                                        super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                        .
                                        super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                      ).
                                      super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                              + local_200)),1,1,(MFInfo *)local_2c8,
                     (FabFactory<amrex::IArrayBox> *)&local_3c0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&vStack_2b8);
          FabArray<amrex::IArrayBox>::BuildMask<amrex::IArrayBox,_0>
                    ((FabArray<amrex::IArrayBox> *)local_1b0,(Box *)(lVar24 + 0xac),&local_1d8,0,1,2
                     ,0);
          local_264.do_tiling = false;
          local_264.dynamic = true;
          local_264.device_sync = true;
          local_264.num_streams = Gpu::Device::max_gpu_streams;
          local_264.tilesize.vect[0] = 0;
          local_264.tilesize.vect[1] = 0;
          local_264.tilesize.vect[2] = 0;
          if ((local_358 != 0) && (this->m_overset_dirichlet_mask != false)) {
            local_2c8._0_8_ =
                 (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)
                 0x200000002;
            local_2c8._8_4_ = 2;
            average_down_nodal<amrex::IArrayBox>
                      (*(FabArray<amrex::IArrayBox> **)
                        (*(long *)((long)&(((this->m_dirichlet_mask).
                                            super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                            .
                                            super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                                          ).
                                          super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                                  + local_308 * 8) + -8 + local_358 * 8),local_348,
                       (IntVect *)local_2c8,0,false);
          }
          MFIter::MFIter((MFIter *)local_2c8,&local_348->super_FabArrayBase,&local_264);
          iVar10 = local_320;
          if ((int)vStack_2b8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage < local_2a0) {
            local_2e8 = (long)local_328._4_4_;
            lVar24 = (long)local_320;
            local_2f0 = (long)local_31c[0];
            local_2f8 = (long)local_31c[1];
            local_2e0 = (long)(int)uStack_314;
            local_300 = (long)(int)local_328;
            do {
              BATransformer::operator()
                        (&local_1cc,(BATransformer *)(local_2c8._8_8_ + 8),
                         (Box *)((long)(local_290->super_vector<int,_std::allocator<int>_>).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start
                                       [(int)vStack_2b8.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage] *
                                 0x1c + *(long *)&(((((BoxArray *)(local_2c8._8_8_ + 8))->m_ref).
                                                                                                        
                                                  super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->m_abox).
                                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                                                  .
                                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                                  ._M_impl.super__Vector_impl_data));
              FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>
                        (&local_3c0,local_348,(MFIter *)local_2c8);
              FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                        (&local_250,(FabArray<amrex::IArrayBox> *)local_1b0,(MFIter *)local_2c8);
              if (local_1cc.smallend.vect[2] <= local_1cc.bigend.vect[2]) {
                iVar18 = local_1cc.bigend.vect[0] + 1;
                iVar29 = local_1cc.smallend.vect[2];
                do {
                  if (local_1cc.smallend.vect[1] <= local_1cc.bigend.vect[1]) {
                    local_340 = CONCAT44(local_3c0.jstride._4_4_,(int)local_3c0.jstride);
                    local_368 = local_3c0.kstride;
                    iVar25 = local_1cc.smallend.vect[1];
                    do {
                      if (local_1cc.smallend.vect[0] <= local_1cc.bigend.vect[0]) {
                        local_380._M_t.
                        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                        .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                             (tuple<amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                              )CONCAT44(local_250.p._4_4_,(int)local_250.p);
                        local_360 = (FabArrayBase *)
                                    CONCAT44(local_250.jstride._4_4_,(int)local_250.jstride);
                        local_378 = CONCAT44(local_250.kstride._4_4_,(int)local_250.kstride);
                        iVar9 = local_1cc.smallend.vect[0];
                        do {
                          lVar15 = ((long)iVar29 - (long)local_3c0.begin.z) * local_3c0.kstride;
                          lVar13 = (long)(iVar9 - local_3c0.begin.x) * 4 +
                                   ((long)iVar25 - (long)local_3c0.begin.y) * local_340 * 4;
                          if (*(int *)((long)local_3c0.p + lVar15 * 4 + lVar13) == 0) {
                            lVar20 = (long)(~local_250.begin.x + iVar9);
                            lVar21 = (long)(~local_250.begin.y + iVar25) * (long)local_360;
                            lVar27 = (~local_250.begin.z + iVar29) * local_378;
                            uVar23 = 1;
                            if (((((((IntVect *)
                                    &((FabArrayBase *)
                                     local_380._M_t.
                                     super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                     .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                     _M_head_impl)->_vptr_FabArrayBase)->vect
                                    [lVar21 + lVar20 + lVar27] != 1) &&
                                  (lVar28 = (long)(iVar9 - local_250.begin.x),
                                  ((IntVect *)
                                  &((FabArrayBase *)
                                   local_380._M_t.
                                   super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                   .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl
                                   )->_vptr_FabArrayBase)->vect[lVar21 + lVar28 + lVar27] != 1)) &&
                                 (lVar26 = (long)(iVar25 - local_250.begin.y) * (long)local_360,
                                 ((IntVect *)
                                 &((FabArrayBase *)
                                  local_380._M_t.
                                  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                  .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)
                                  ->_vptr_FabArrayBase)->vect[lVar26 + lVar20 + lVar27] != 1)) &&
                                ((((IntVect *)
                                  &((FabArrayBase *)
                                   local_380._M_t.
                                   super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                   .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl
                                   )->_vptr_FabArrayBase)->vect[lVar26 + lVar28 + lVar27] != 1 &&
                                 (lVar27 = (iVar29 - local_250.begin.z) * local_378,
                                 ((IntVect *)
                                 &((FabArrayBase *)
                                  local_380._M_t.
                                  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                  .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)
                                  ->_vptr_FabArrayBase)->vect[lVar21 + lVar20 + lVar27] != 1)))) &&
                               ((((IntVect *)
                                 &((FabArrayBase *)
                                  local_380._M_t.
                                  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                  .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)
                                  ->_vptr_FabArrayBase)->vect[lVar21 + lVar28 + lVar27] != 1 &&
                                (((IntVect *)
                                 &((FabArrayBase *)
                                  local_380._M_t.
                                  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                  .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)
                                  ->_vptr_FabArrayBase)->vect[lVar26 + lVar20 + lVar27] != 1)))) {
                              uVar23 = (uint)(((IntVect *)
                                              &((FabArrayBase *)
                                               local_380._M_t.
                                               super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                               .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                               _M_head_impl)->_vptr_FabArrayBase)->vect
                                              [lVar26 + lVar28 + lVar27] == 1);
                            }
                            *(uint *)((long)local_3c0.p + lVar15 * 4 + lVar13) = uVar23;
                          }
                          iVar9 = iVar9 + 1;
                        } while (iVar18 != iVar9);
                      }
                      bVar30 = iVar25 != local_1cc.bigend.vect[1];
                      iVar25 = iVar25 + 1;
                    } while (bVar30);
                  }
                  bVar30 = iVar29 != local_1cc.bigend.vect[2];
                  iVar29 = iVar29 + 1;
                } while (bVar30);
                if ((local_1cc.smallend.vect[0] == (int)local_300 && (int)local_1e8 == 0x65) &&
                    local_1cc.smallend.vect[2] <= local_1cc.bigend.vect[2]) {
                  iVar29 = local_1cc.smallend.vect[2];
                  do {
                    iVar25 = local_1cc.smallend.vect[1];
                    if (local_1cc.smallend.vect[1] <= local_1cc.bigend.vect[1]) {
                      do {
                        *(undefined4 *)
                         ((long)local_3c0.p +
                         ((long)iVar29 - (long)local_3c0.begin.z) * local_3c0.kstride * 4 +
                         (local_300 - local_3c0.begin.x) * 4 +
                         (long)(iVar25 - local_3c0.begin.y) *
                         CONCAT44(local_3c0.jstride._4_4_,(int)local_3c0.jstride) * 4) = 1;
                        iVar25 = iVar25 + 1;
                      } while (local_1cc.bigend.vect[1] + 1 != iVar25);
                    }
                    bVar30 = iVar29 != local_1cc.bigend.vect[2];
                    iVar29 = iVar29 + 1;
                  } while (bVar30);
                }
                if ((local_1cc.bigend.vect[0] == (int)local_2f0 && (int)local_1f0 == 0x65) &&
                    local_1cc.smallend.vect[2] <= local_1cc.bigend.vect[2]) {
                  iVar29 = local_1cc.smallend.vect[2];
                  do {
                    iVar25 = local_1cc.smallend.vect[1];
                    if (local_1cc.smallend.vect[1] <= local_1cc.bigend.vect[1]) {
                      do {
                        *(undefined4 *)
                         ((long)local_3c0.p +
                         ((long)iVar29 - (long)local_3c0.begin.z) * local_3c0.kstride * 4 +
                         (local_2f0 - local_3c0.begin.x) * 4 +
                         (long)(iVar25 - local_3c0.begin.y) *
                         CONCAT44(local_3c0.jstride._4_4_,(int)local_3c0.jstride) * 4) = 1;
                        iVar25 = iVar25 + 1;
                      } while (local_1cc.bigend.vect[1] + 1 != iVar25);
                    }
                    bVar30 = iVar29 != local_1cc.bigend.vect[2];
                    iVar29 = iVar29 + 1;
                  } while (bVar30);
                }
                if ((local_1cc.smallend.vect[1] == (int)local_2e8 && local_1f8 == 0x6500000000) &&
                    local_1cc.smallend.vect[2] <= local_1cc.bigend.vect[2]) {
                  iVar29 = local_1cc.smallend.vect[2];
                  do {
                    iVar25 = local_1cc.smallend.vect[0];
                    if (local_1cc.smallend.vect[0] <= local_1cc.bigend.vect[0]) {
                      do {
                        *(undefined4 *)
                         ((long)local_3c0.p +
                         ((long)iVar29 - (long)local_3c0.begin.z) * local_3c0.kstride * 4 +
                         (long)(iVar25 - local_3c0.begin.x) * 4 +
                         (local_2e8 - local_3c0.begin.y) *
                         CONCAT44(local_3c0.jstride._4_4_,(int)local_3c0.jstride) * 4) = 1;
                        iVar25 = iVar25 + 1;
                      } while (iVar18 != iVar25);
                    }
                    bVar30 = iVar29 != local_1cc.bigend.vect[2];
                    iVar29 = iVar29 + 1;
                  } while (bVar30);
                }
                this = local_350;
                if ((local_1cc.bigend.vect[1] == (int)local_2f8 && local_1e0 == 0x6500000000) &&
                    local_1cc.smallend.vect[2] <= local_1cc.bigend.vect[2]) {
                  iVar29 = local_1cc.smallend.vect[2];
                  do {
                    iVar25 = local_1cc.smallend.vect[0];
                    if (local_1cc.smallend.vect[0] <= local_1cc.bigend.vect[0]) {
                      do {
                        *(undefined4 *)
                         ((long)local_3c0.p +
                         ((long)iVar29 - (long)local_3c0.begin.z) * local_3c0.kstride * 4 +
                         (long)(iVar25 - local_3c0.begin.x) * 4 +
                         (local_2f8 - local_3c0.begin.y) *
                         CONCAT44(local_3c0.jstride._4_4_,(int)local_3c0.jstride) * 4) = 1;
                        iVar25 = iVar25 + 1;
                      } while (iVar18 != iVar25);
                    }
                    bVar30 = iVar29 != local_1cc.bigend.vect[2];
                    iVar29 = iVar29 + 1;
                  } while (bVar30);
                }
              }
              if (local_1cc.smallend.vect[1] <= local_1cc.bigend.vect[1] &&
                  (local_1cc.smallend.vect[2] == iVar10 && local_36c == Dirichlet)) {
                iVar29 = local_1cc.smallend.vect[1];
                do {
                  iVar18 = local_1cc.smallend.vect[0];
                  if (local_1cc.smallend.vect[0] <= local_1cc.bigend.vect[0]) {
                    do {
                      *(undefined4 *)
                       ((long)local_3c0.p +
                       (lVar24 - local_3c0.begin.z) * local_3c0.kstride * 4 +
                       (long)(iVar18 - local_3c0.begin.x) * 4 +
                       ((long)iVar29 - (long)local_3c0.begin.y) *
                       CONCAT44(local_3c0.jstride._4_4_,(int)local_3c0.jstride) * 4) = 1;
                      iVar18 = iVar18 + 1;
                    } while (local_1cc.bigend.vect[0] + 1 != iVar18);
                  }
                  bVar30 = iVar29 != local_1cc.bigend.vect[1];
                  iVar29 = iVar29 + 1;
                } while (bVar30);
              }
              if ((local_1cc.bigend.vect[2] == (int)local_2e0 && local_32c == Dirichlet) &&
                  local_1cc.smallend.vect[1] <= local_1cc.bigend.vect[1]) {
                iVar29 = local_1cc.smallend.vect[1];
                do {
                  iVar18 = local_1cc.smallend.vect[0];
                  if (local_1cc.smallend.vect[0] <= local_1cc.bigend.vect[0]) {
                    do {
                      *(undefined4 *)
                       ((long)local_3c0.p +
                       (local_2e0 - local_3c0.begin.z) * local_3c0.kstride * 4 +
                       (long)(iVar18 - local_3c0.begin.x) * 4 +
                       ((long)iVar29 - (long)local_3c0.begin.y) *
                       CONCAT44(local_3c0.jstride._4_4_,(int)local_3c0.jstride) * 4) = 1;
                      iVar18 = iVar18 + 1;
                    } while (local_1cc.bigend.vect[0] + 1 != iVar18);
                  }
                  bVar30 = iVar29 != local_1cc.bigend.vect[1];
                  iVar29 = iVar29 + 1;
                } while (bVar30);
              }
              MFIter::operator++((MFIter *)local_2c8);
            } while ((int)vStack_2b8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage < local_2a0);
          }
          MFIter::~MFIter((MFIter *)local_2c8);
          iMultiFab::~iMultiFab((iMultiFab *)local_1b0);
          lVar13 = local_358 + 1;
          piVar16 = (this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
        } while (lVar13 < piVar16[local_208]);
        iVar10 = (this->super_MLLinOp).m_num_amr_levels;
        lVar24 = local_208;
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 < iVar10);
    if (1 < iVar10) {
      lVar13 = 0;
      do {
        puVar17 = (this->m_cc_fine_mask).
                  super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                  .
                  super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        cmf.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
        super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
        super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
             puVar17[lVar13]._M_t.
             super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>;
        this_01.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t
        .super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
        super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
             (this->m_nd_fine_mask).
             super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar13]._M_t.
             super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>;
        _Var3.
        super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
        .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl =
             (this->m_has_fine_bndry).
             super_vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar13]._M_t.
             super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
        ;
        piVar16 = (this->super_MLLinOp).m_amr_ref_ratio.super_vector<int,_std::allocator<int>_>.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        pVVar14 = (this->super_MLLinOp).m_geom.
                  super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  .
                  super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_380._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
             (tuple<amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
             (*(long *)&pVVar14[lVar13].
                        super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                        super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_> + 0xac
             );
        if ((piVar16[lVar13] != 2) && (piVar16[lVar13] != 4)) {
          Assert_host("AMRRefRatio(amrlev) == 2 || AMRRefRatio(amrlev) == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLinOp.cpp"
                      ,0x149,"\"ref_ratio != 2 and 4 not supported\"");
          puVar17 = (this->m_cc_fine_mask).
                    super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                    .
                    super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          piVar16 = (this->super_MLLinOp).m_amr_ref_ratio.super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
          pVVar14 = (this->super_MLLinOp).m_geom.
                    super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        fmf.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
        super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
        super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
             puVar17[lVar13 + 1]._M_t.
             super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>;
        local_2c8._0_8_ =
             *(undefined8 *)
              ((IntVect *)
              ((long)cmf.
                     super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                     .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl + 0xc0))->vect;
        local_2c8._8_4_ =
             *(int *)((long)cmf.
                            super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                            .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl + 200);
        local_3c0.jstride._0_4_ = piVar16[lVar13];
        local_3c0.p = (int *)CONCAT44((int)local_3c0.jstride,(int)local_3c0.jstride);
        PVar31 = Geometry::periodicity
                           (*(Geometry **)
                             &pVVar14[lVar13].
                              super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>)
        ;
        local_250.p._0_4_ = PVar31.period.vect[0];
        local_250.p._4_4_ = PVar31.period.vect[1];
        local_250.jstride._0_4_ = PVar31.period.vect[2];
        makeFineMask<amrex::IArrayBox>
                  ((iMultiFab *)local_1b0,
                   (FabArray<amrex::IArrayBox> *)
                   cmf.
                   super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                   .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,
                   (FabArray<amrex::IArrayBox> *)
                   fmf.
                   super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                   .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,
                   (IntVect *)local_2c8,(IntVect *)&local_3c0,(Periodicity *)&local_250,0,1,
                   (LayoutData<int> *)
                   _Var3.
                   super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
                   .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl);
        FabArray<amrex::IArrayBox>::operator=
                  ((FabArray<amrex::IArrayBox> *)
                   cmf.
                   super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                   .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,
                   (FabArray<amrex::IArrayBox> *)local_1b0);
        iMultiFab::~iMultiFab((iMultiFab *)local_1b0);
        MFIter::MFIter((MFIter *)local_1b0,
                       (FabArrayBase *)
                       cmf.
                       super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                       .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,'\0');
        uVar7 = local_210;
        LVar5 = local_36c;
        domain._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
             (tuple<amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
             (tuple<amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)local_380;
        if ((int)avStack_1a0[0].
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ <
            (int)avStack_1a0[1].
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._0_4_) {
          do {
            BATransformer::operator()
                      ((Box *)&local_3c0,&(local_1a8->boxarray).m_bat,
                       (Box *)((long)*(int *)(*(long *)avStack_1a0[1].
                                                                                                              
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + (long)(int)avStack_1a0[0].
                                                                                                                    
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_4_ * 4) * 0x1c +
                              *(long *)&(((local_1a8->boxarray).m_ref.
                                          super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->m_abox).
                                        super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                        _M_impl.super__Vector_impl_data));
            FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>
                      ((Array4<int> *)local_2c8,
                       (FabArray<amrex::IArrayBox> *)
                       cmf.
                       super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                       .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,
                       (MFIter *)local_1b0);
            uVar8 = local_210;
            bchi.arr[2] = local_338.arr[2];
            bchi.arr[0] = local_338.arr[0];
            bchi.arr[1] = local_338.arr[1];
            bclo.arr[2] = LVar5;
            local_210._0_4_ = (undefined4)uVar7;
            local_210._4_4_ = SUB84(uVar7,4);
            bclo.arr[0] = (undefined4)local_210;
            bclo.arr[1] = local_210._4_4_;
            local_210 = uVar8;
            mlndlap_fillbc_cc<int>
                      ((Box *)&local_3c0,(Array4<int> *)local_2c8,
                       (Box *)domain._M_t.
                              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl,bclo
                       ,bchi);
            MFIter::operator++((MFIter *)local_1b0);
          } while ((int)avStack_1a0[0].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ <
                   (int)avStack_1a0[1].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start._0_4_);
        }
        MFIter::~MFIter((MFIter *)local_1b0);
        MFIter::MFIter((MFIter *)local_1b0,
                       (FabArrayBase *)
                       this_01.
                       super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                       .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,true);
        if ((int)avStack_1a0[0].
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ <
            (int)avStack_1a0[1].
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._0_4_) {
          do {
            MFIter::tilebox((Box *)&local_250,(MFIter *)local_1b0);
            FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>
                      ((Array4<int> *)local_2c8,
                       (FabArray<amrex::IArrayBox> *)
                       this_01.
                       super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                       .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,
                       (MFIter *)local_1b0);
            FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                      ((Array4<const_int> *)&local_3c0,
                       (FabArray<amrex::IArrayBox> *)
                       cmf.
                       super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                       .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,
                       (MFIter *)local_1b0);
            if ((int)local_250.jstride <= local_250.kstride._4_4_) {
              local_378 = CONCAT44(local_378._4_4_,(int)local_250.p);
              local_368 = CONCAT44(local_368._4_4_,local_250.p._4_4_);
              local_340 = (ulong)local_250.jstride._4_4_;
              iVar10 = (int)local_250.jstride;
              do {
                if (local_250.p._4_4_ <= (int)local_250.kstride) {
                  iVar29 = local_250.p._4_4_;
                  do {
                    if ((int)local_250.p <= (int)local_250.jstride._4_4_) {
                      local_380._M_t.
                      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                      .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                           (tuple<amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
                           (tuple<amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
                           local_2c8._0_8_;
                      local_360 = (FabArrayBase *)local_2c8._8_8_;
                      iVar18 = (int)local_250.p;
                      do {
                        iVar25 = iVar18 - local_3c0.begin.x;
                        lVar15 = (long)(~local_3c0.begin.y + iVar29) *
                                 CONCAT44(local_3c0.jstride._4_4_,(int)local_3c0.jstride);
                        lVar27 = (~local_3c0.begin.z + iVar10) * local_3c0.kstride;
                        lVar24 = (long)(iVar25 + -1) * 4 + lVar15 * 4;
                        lVar15 = (long)iVar25 * 4 + lVar15 * 4;
                        lVar21 = (long)(iVar29 - local_3c0.begin.y) *
                                 CONCAT44(local_3c0.jstride._4_4_,(int)local_3c0.jstride);
                        lVar20 = (long)(iVar25 + -1) * 4 + lVar21 * 4;
                        lVar21 = (long)iVar25 * 4 + lVar21 * 4;
                        lVar28 = (iVar10 - local_3c0.begin.z) * local_3c0.kstride;
                        iVar19 = *(int *)((long)local_3c0.p + lVar27 * 4 + lVar15) +
                                 *(int *)((long)local_3c0.p + lVar27 * 4 + lVar24) +
                                 *(int *)((long)local_3c0.p + lVar27 * 4 + lVar20) +
                                 *(int *)((long)local_3c0.p + lVar27 * 4 + lVar21) +
                                 *(int *)((long)local_3c0.p + lVar28 * 4 + lVar24) +
                                 *(int *)((long)local_3c0.p + lVar28 * 4 + lVar15) +
                                 *(int *)((long)local_3c0.p + lVar28 * 4 + lVar20);
                        iVar25 = *(int *)((long)local_3c0.p + lVar28 * 4 + lVar21);
                        iVar9 = (iVar25 + iVar19 == 8) + 1;
                        if (iVar19 + iVar25 == 0) {
                          iVar9 = 0;
                        }
                        *(int *)(local_2c8._0_8_ +
                                 ((long)iVar29 -
                                 (long)vStack_2b8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                                 local_2c8._8_8_ * 4 +
                                 (long)(iVar18 - (int)vStack_2b8.
                                                                                                            
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                       ) * 4 +
                                ((long)iVar10 - (long)local_2a0) *
                                (long)vStack_2b8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start * 4) = iVar9;
                        iVar18 = iVar18 + 1;
                      } while (local_250.jstride._4_4_ + 1 != iVar18);
                    }
                    bVar30 = iVar29 != (int)local_250.kstride;
                    iVar29 = iVar29 + 1;
                  } while (bVar30);
                }
                bVar30 = iVar10 != local_250.kstride._4_4_;
                iVar10 = iVar10 + 1;
              } while (bVar30);
            }
            MFIter::operator++((MFIter *)local_1b0);
          } while ((int)avStack_1a0[0].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ <
                   (int)avStack_1a0[1].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start._0_4_);
        }
        lVar13 = lVar13 + 1;
        MFIter::~MFIter((MFIter *)local_1b0);
        lVar24 = (long)(local_350->super_MLLinOp).m_num_amr_levels + -1;
        this = local_350;
      } while (lVar13 < lVar24);
      goto LAB_0064e99e;
    }
  }
  lVar24 = (long)(iVar10 + -1);
LAB_0064e99e:
  _Var3.super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>.
  super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl =
       (this->m_has_fine_bndry).
       super_vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
       .
       super__Vector_base<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[lVar24]._M_t.
       super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>;
  MFIter::MFIter((MFIter *)local_1b0,
                 (FabArrayBase *)
                 _Var3.
                 super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
                 .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl,'\0');
  if ((int)avStack_1a0[0].
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ <
      (int)avStack_1a0[1].
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start._0_4_) {
    do {
      iVar10 = avStack_1a0[0].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
      if (avStack_1a0[2].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        iVar10 = *(int *)(*(long *)avStack_1a0[2].
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                         (long)(int)avStack_1a0[0].
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ * 4);
      }
      *(undefined4 *)
       ((long)((FabArrayBase *)
              ((long)_Var3.
                     super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
                     .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl + 0xf0))->
              _vptr_FabArrayBase + (long)iVar10 * 4) = 0;
      MFIter::operator++((MFIter *)local_1b0);
    } while ((int)avStack_1a0[0].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ <
             (int)avStack_1a0[1].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._0_4_);
  }
  MFIter::~MFIter((MFIter *)local_1b0);
  pMVar6 = local_350;
  iVar10 = *(local_350->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  lVar24 = *(long *)&(((local_350->super_MLLinOp).m_geom.
                       super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  piVar4 = (local_350->m_owner_mask_bottom)._M_t.
           super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
           super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
  this_00 = &local_350->m_bottom_dot_mask;
  local_1b0 = (undefined1  [8])0x1;
  local_1a8 = (FabArrayBase *)0x0;
  avStack_1a0[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_1a0[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_1a0[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c8._0_8_ = &PTR__FabFactory_00712918;
  MultiFab::define(this_00,(BoxArray *)
                           ((long)&(piVar4->super_FabArray<amrex::IArrayBox>).super_FabArrayBase + 8
                           ),
                   (DistributionMapping *)
                   ((long)&(piVar4->super_FabArray<amrex::IArrayBox>).super_FabArrayBase + 0x70),1,0
                   ,(MFInfo *)local_1b0,(FabFactory<amrex::FArrayBox> *)local_2c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(avStack_1a0);
  anon_unknown_1::MLNodeLinOp_set_dot_mask
            (this_00,piVar4,(Geometry *)((long)iVar10 * 200 + lVar24 + -200),&local_2d8,&local_338,
             pMVar6->m_coarsening_strategy);
  if (pMVar6->m_is_bottom_singular == true) {
    piVar4 = (pMVar6->m_owner_mask_top)._M_t.
             super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
             super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
             super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
    geom = *(Geometry **)
            &(((pMVar6->super_MLLinOp).m_geom.
               super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
               .
               super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
             super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
    local_1b0 = (undefined1  [8])0x1;
    local_1a8 = (FabArrayBase *)0x0;
    avStack_1a0[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    avStack_1a0[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    avStack_1a0[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2c8._0_8_ = &PTR__FabFactory_00712918;
    MultiFab::define(&pMVar6->m_coarse_dot_mask,
                     (BoxArray *)
                     ((long)&(piVar4->super_FabArray<amrex::IArrayBox>).super_FabArrayBase + 8),
                     (DistributionMapping *)
                     ((long)&(piVar4->super_FabArray<amrex::IArrayBox>).super_FabArrayBase + 0x70),1
                     ,0,(MFInfo *)local_1b0,(FabFactory<amrex::FArrayBox> *)local_2c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(avStack_1a0);
    anon_unknown_1::MLNodeLinOp_set_dot_mask
              (&pMVar6->m_coarse_dot_mask,piVar4,geom,&local_2d8,&local_338,
               pMVar6->m_coarsening_strategy);
  }
  return;
}

Assistant:

void
MLNodeLinOp::buildMasks ()
{
    if (m_masks_built) return;

    BL_PROFILE("MLNodeLinOp::buildMasks()");

    m_masks_built = true;

    m_is_bottom_singular = false;
    auto itlo = std::find(m_lobc[0].begin(), m_lobc[0].end(), BCType::Dirichlet);
    auto ithi = std::find(m_hibc[0].begin(), m_hibc[0].end(), BCType::Dirichlet);
    if (itlo == m_lobc[0].end() && ithi == m_hibc[0].end())
    {  // No Dirichlet
        m_is_bottom_singular = (m_domain_covered[0] && !m_overset_dirichlet_mask);
    }

    const auto lobc = LoBC();
    const auto hibc = HiBC();

    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            const Geometry& geom = m_geom[amrlev][mglev];
            const auto& period = geom.periodicity();
            const Box& ccdomain = geom.Domain();
            const Box& nddomain = amrex::surroundingNodes(ccdomain);

            auto& dmask = *m_dirichlet_mask[amrlev][mglev];

            iMultiFab ccm(m_grids[amrlev][mglev],m_dmap[amrlev][mglev],1,1);
            ccm.BuildMask(ccdomain,period,0,1,2,0);

            MFItInfo mfi_info;
            if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);

            if (m_overset_dirichlet_mask && mglev > 0) {
                const auto& dmask_fine = *m_dirichlet_mask[amrlev][mglev-1];
                amrex::average_down_nodal(dmask_fine, dmask, IntVect(2));
            }
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(dmask, mfi_info); mfi.isValid(); ++mfi)
            {
                const Box& ndbx = mfi.validbox();
                Array4<int> const& mskarr = dmask.array(mfi);
                Array4<int const> const& ccarr = ccm.const_array(mfi);
                AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( ndbx, tbx,
                {
                    mlndlap_set_dirichlet_mask(tbx, mskarr, ccarr, nddomain, lobc, hibc);
                });
            }
        }
    }

    for (int amrlev = 0; amrlev < m_num_amr_levels-1; ++amrlev)
    {
        iMultiFab& cc_mask = *m_cc_fine_mask[amrlev];
        iMultiFab& nd_mask = *m_nd_fine_mask[amrlev];
        LayoutData<int>& has_cf = *m_has_fine_bndry[amrlev];
        const Box& ccdom = m_geom[amrlev][0].Domain();

        AMREX_ALWAYS_ASSERT_WITH_MESSAGE(AMRRefRatio(amrlev) == 2 || AMRRefRatio(amrlev) == 4,
                                         "ref_ratio != 2 and 4 not supported");

        cc_mask = amrex::makeFineMask(cc_mask, *m_cc_fine_mask[amrlev+1], cc_mask.nGrowVect(),
                                      IntVect(AMRRefRatio(amrlev)), m_geom[amrlev][0].periodicity(),
                                      0, 1, has_cf); // coarse: 0, fine: 1

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(cc_mask); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.validbox();
            Array4<int> const& fab = cc_mask.array(mfi);
            mlndlap_fillbc_cc<int>(bx,fab,ccdom,lobc,hibc);
        }

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(nd_mask,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<int> const& nmsk = nd_mask.array(mfi);
            Array4<int const> const& cmsk = cc_mask.const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
            {
                mlndlap_set_nodal_mask(i,j,k,nmsk,cmsk);
            });
        }
    }

    auto& has_cf = *m_has_fine_bndry[m_num_amr_levels-1];
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
    for (MFIter mfi(has_cf); mfi.isValid(); ++mfi)
    {
        has_cf[mfi] = 0;
    }

    {
        int amrlev = 0;
        int mglev = m_num_mg_levels[amrlev]-1;
        const Geometry& geom = m_geom[amrlev][mglev];
        const iMultiFab& omask = *m_owner_mask_bottom;
        m_bottom_dot_mask.define(omask.boxArray(), omask.DistributionMap(), 1, 0);
        MLNodeLinOp_set_dot_mask(m_bottom_dot_mask, omask, geom, lobc, hibc, m_coarsening_strategy);
    }

    if (m_is_bottom_singular)
    {
        int amrlev = 0;
        int mglev = 0;
        const Geometry& geom = m_geom[amrlev][mglev];
        const iMultiFab& omask = *m_owner_mask_top;
        m_coarse_dot_mask.define(omask.boxArray(), omask.DistributionMap(), 1, 0);
        MLNodeLinOp_set_dot_mask(m_coarse_dot_mask, omask, geom, lobc, hibc, m_coarsening_strategy);
    }
}